

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O0

size_t Output::PrintBuffer(char16 *buf,size_t size)

{
  code *pcVar1;
  size_t *dst;
  bool bVar2;
  byte *pbVar3;
  char16_t *pcVar4;
  undefined4 *puVar5;
  size_t sVar6;
  ulong *puVar7;
  undefined1 *puVar8;
  long *plVar9;
  long lVar10;
  undefined8 *puVar11;
  _PAL_FILE *p_Var12;
  PAL_FILE *stream;
  bool local_89;
  char16_t *pcStack_88;
  bool useConsoleOrFile;
  char16 *endbuf;
  size_t charsToCopy;
  char16 *endOfLine;
  uint i;
  uint alignspacesneeded;
  size_t oldS_Column;
  size_t prefixlength;
  anon_class_24_3_135c38f6 ensureSpace;
  char16 *currentWriteIndex;
  char16 *currentReadIndex;
  char16 *newbuf;
  size_t newbufsize;
  size_t sStack_18;
  bool internallyAllocatedBuffer;
  size_t size_local;
  char16 *buf_local;
  
  newbufsize._7_1_ = 0;
  sStack_18 = size;
  size_local = (size_t)buf;
  pbVar3 = (byte *)__tls_get_addr(&PTR_01e57eb8);
  if (((*pbVar3 & 1) != 0) &&
     ((pbVar3 = (byte *)__tls_get_addr(&PTR_01e57ea8), (*pbVar3 & 1) == 0 ||
      (pcVar4 = PAL_wcschr((char16_t *)size_local,L'\n'), pcVar4 != (char16_t *)0x0)))) {
    sVar6 = sStack_18;
    plVar9 = (long *)__tls_get_addr(&PTR_01e57fa0);
    newbuf = (char16 *)(sVar6 + *plVar9);
    currentReadIndex = (char16 *)calloc((size_t)newbuf,2);
    if (currentReadIndex == (char16 *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/Output.cpp"
                         ,0x12e,"(newbuf != nullptr)","Ran out of memory while printing output");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    newbufsize._7_1_ = 1;
    currentWriteIndex = (char16 *)size_local;
    ensureSpace.newbufsize = (size_t *)currentReadIndex;
    prefixlength = (size_t)&ensureSpace.newbufsize;
    ensureSpace.currentWriteIndex = &currentReadIndex;
    ensureSpace.newbuf = &newbuf;
    puVar11 = (undefined8 *)__tls_get_addr(&PTR_01e57f78);
    sVar6 = PAL_wcslen((char16_t *)*puVar11);
    puVar7 = (ulong *)__tls_get_addr(&PTR_01e57f88);
    _i = *puVar7;
    for (; currentWriteIndex < (char16 *)(size_local + sStack_18 * 2);
        currentWriteIndex = currentWriteIndex + (long)endbuf) {
      pbVar3 = (byte *)__tls_get_addr(&PTR_01e57ea8);
      if ((*pbVar3 & 1) == 0) {
        endOfLine._4_4_ = 1;
        puVar7 = (ulong *)__tls_get_addr(&PTR_01e57fa0);
        if (_i < *puVar7) {
          puVar11 = (undefined8 *)__tls_get_addr(&PTR_01e57fa0);
          endOfLine._4_4_ = (int)*puVar11 - (int)_i;
        }
        PrintBuffer::anon_class_24_3_135c38f6::operator()
                  ((anon_class_24_3_135c38f6 *)&prefixlength,(ulong)endOfLine._4_4_);
        for (endOfLine._0_4_ = 0; (uint)endOfLine < endOfLine._4_4_;
            endOfLine._0_4_ = (uint)endOfLine + 1) {
          *(undefined2 *)ensureSpace.newbufsize = 0x20;
          ensureSpace.newbufsize = (size_t *)((long)ensureSpace.newbufsize + 2);
        }
        PrintBuffer::anon_class_24_3_135c38f6::operator()
                  ((anon_class_24_3_135c38f6 *)&prefixlength,sVar6);
        dst = ensureSpace.newbufsize;
        lVar10 = (long)currentReadIndex + ((long)newbuf * 2 - (long)ensureSpace.newbufsize);
        puVar11 = (undefined8 *)__tls_get_addr(&PTR_01e57f78);
        js_wmemcpy_s((char16 *)dst,lVar10 >> 1,(char16 *)*puVar11,sVar6);
        ensureSpace.newbufsize = (size_t *)(sVar6 * 2 + (long)ensureSpace.newbufsize);
        plVar9 = (long *)__tls_get_addr(&PTR_01e57fa0);
        _i = *plVar9 + sVar6;
        puVar8 = (undefined1 *)__tls_get_addr(&PTR_01e57ea8);
        *puVar8 = 1;
      }
      pcVar4 = PAL_wcschr(currentWriteIndex,L'\n');
      if (pcVar4 == (char16_t *)0x0) {
        endbuf = (char16 *)((long)((size_local + sStack_18 * 2) - (long)currentWriteIndex) >> 1);
        _i = (long)endbuf + _i;
      }
      else {
        endbuf = (char16 *)(((long)pcVar4 - (long)currentWriteIndex >> 1) + 1);
        _i = 0;
        puVar8 = (undefined1 *)__tls_get_addr(&PTR_01e57ea8);
        *puVar8 = 0;
      }
      PrintBuffer::anon_class_24_3_135c38f6::operator()
                ((anon_class_24_3_135c38f6 *)&prefixlength,
                 (long)pcVar4 - (long)currentWriteIndex >> 1);
      js_wmemcpy_s((char16 *)ensureSpace.newbufsize,
                   (long)currentReadIndex + ((long)newbuf * 2 - (long)ensureSpace.newbufsize) >> 1,
                   currentWriteIndex,(size_t)endbuf);
      ensureSpace.newbufsize = (size_t *)((long)endbuf * 2 + (long)ensureSpace.newbufsize);
    }
    PrintBuffer::anon_class_24_3_135c38f6::operator()((anon_class_24_3_135c38f6 *)&prefixlength,1);
    *(undefined2 *)ensureSpace.newbufsize = 0;
    size_local = (size_t)currentReadIndex;
    sStack_18 = (((long)ensureSpace.newbufsize + 2) - (long)currentReadIndex >> 1) - 1;
    ensureSpace.newbufsize = (size_t *)((long)ensureSpace.newbufsize + 2);
  }
  sVar6 = sStack_18;
  plVar9 = (long *)__tls_get_addr(&PTR_01e57f88);
  *plVar9 = sVar6 + *plVar9;
  for (pcStack_88 = PAL_wcschr((char16_t *)size_local,L'\n'); pcStack_88 != (char16_t *)0x0;
      pcStack_88 = PAL_wcschr(pcStack_88 + 1,L'\n')) {
    lVar10 = sStack_18 - ((long)((long)pcStack_88 - size_local) >> 1);
    plVar9 = (long *)__tls_get_addr(&PTR_01e57f88);
    *plVar9 = lVar10 + -1;
  }
  local_89 = true;
  pbVar3 = (byte *)__tls_get_addr(&PTR_01e57e60);
  if ((*pbVar3 & 1) == 0) {
    local_89 = (s_useDebuggerWindow & 1U) != 0;
    if (local_89) {
      OutputDebugStringW((LPCWSTR)size_local);
    }
    local_89 = !local_89;
    if (s_inMemoryLogger != (ILogger *)0x0) {
      (**s_inMemoryLogger->_vptr_ILogger)(s_inMemoryLogger,size_local);
      local_89 = false;
    }
  }
  if (local_89) {
    plVar9 = (long *)__tls_get_addr(&PTR_01e57f28);
    if ((*plVar9 == 0) || (pbVar3 = (byte *)__tls_get_addr(&PTR_01e57e60), (*pbVar3 & 1) != 0)) {
      DirectPrint((char16 *)size_local);
    }
    else {
      puVar11 = (undefined8 *)__tls_get_addr(&PTR_01e57f28);
      PAL_fwprintf((PAL_FILE *)*puVar11,L"%s",size_local);
    }
    p_Var12 = BasePtr::operator_cast_to__PAL_FILE_((BasePtr *)&s_outputFile);
    if ((p_Var12 != (_PAL_FILE *)0x0) &&
       (pbVar3 = (byte *)__tls_get_addr(&PTR_01e57e60), (*pbVar3 & 1) == 0)) {
      stream = (PAL_FILE *)BasePtr::operator_cast_to__PAL_FILE_((BasePtr *)&s_outputFile);
      PAL_fwprintf(stream,L"%s",size_local);
    }
  }
  Flush();
  return sStack_18;
}

Assistant:

size_t __cdecl
Output::PrintBuffer(const char16 * buf, size_t size)
{
    // Handle custom line prefixing
    bool internallyAllocatedBuffer = false;
    if (usingCustomAlignAndPrefix)
    {
        if (hasDoneAlignPrefixForThisLine && wcschr(buf, '\n') == nullptr)
        {
            // no newlines, and we've already prefixed this line, so nothing to do
        }
        else
        {
            size_t newbufsize = size + align;
            char16* newbuf = (char16*)calloc(newbufsize, sizeof(char16));
            AssertOrFailFastMsg(newbuf != nullptr, "Ran out of memory while printing output");
            internallyAllocatedBuffer = true;
            const char16* currentReadIndex = buf;
            char16* currentWriteIndex = newbuf;
            auto ensureSpace = [&currentWriteIndex, &newbuf, &newbufsize](size_t numCharsWantToWrite)
            {
                size_t charsWritten = (currentWriteIndex - newbuf); // pointer subtraction is number of elements of pointed type between pointers
                size_t remaining = newbufsize - charsWritten;
                if (numCharsWantToWrite + 1 > remaining)
                {
                    char16* tempbuf = (char16*)realloc(newbuf, newbufsize * sizeof(char16) * 2);
                    AssertOrFailFastMsg(tempbuf != nullptr, "Ran out of memory while printing output");
                    newbuf = tempbuf;
                    newbufsize = newbufsize * 2;
                    currentWriteIndex = newbuf + charsWritten;
                }
            };
            const size_t prefixlength = wcslen(prefix);
            size_t oldS_Column = Output::s_Column;
            while (currentReadIndex < buf + size)
            {
                if (!hasDoneAlignPrefixForThisLine)
                {
                    // attempt to write the alignment
                    {
                        unsigned int alignspacesneeded = 1; // always put at least one space
                        if (oldS_Column < align)
                        {
                            alignspacesneeded = (unsigned int)(align - oldS_Column);
                        }
                        ensureSpace(alignspacesneeded);
                        for (unsigned int i = 0; i < alignspacesneeded; i++)
                        {
                            *(currentWriteIndex++) = ' ';
                        }
                    }
                    // attempt to write the prefix
                    ensureSpace(prefixlength);
                    js_wmemcpy_s(currentWriteIndex, (newbuf + newbufsize) - currentWriteIndex, Output::prefix, prefixlength);
                    currentWriteIndex += prefixlength;
                    oldS_Column = align + prefixlength;
                    hasDoneAlignPrefixForThisLine = true;
                }
                const char16* endOfLine = wcschr(currentReadIndex, '\n');
                size_t charsToCopy = 0;
                if (endOfLine != nullptr)
                {
                    charsToCopy = (endOfLine - currentReadIndex) + 1; // We want to grab the newline character as part of this line
                    oldS_Column = 0; // We're ending this line, and want the next to be calculated properly
                    hasDoneAlignPrefixForThisLine = false; // The next line will need this
                }
                else
                {
                    charsToCopy = (buf + size) - currentReadIndex; // the rest of the input buffer
                    oldS_Column += charsToCopy; // Will be reset anyway later on
                }
                ensureSpace(endOfLine - currentReadIndex);
                js_wmemcpy_s(currentWriteIndex, (newbuf + newbufsize) - currentWriteIndex, currentReadIndex, charsToCopy);
                currentReadIndex += charsToCopy;
                currentWriteIndex += charsToCopy;
            }
            // null terminate becuase there's no real reason not to
            ensureSpace(1);
            *(currentWriteIndex++) = '\0';
            buf = newbuf;
            size = (currentWriteIndex - newbuf) - 1; // not counting the terminator here though, to align with vsnwprintf_s's behavior
        }
    }
    Output::s_Column += size;
    const char16 * endbuf = wcschr(buf, '\n');
    while (endbuf != nullptr)
    {
        Output::s_Column = size - (endbuf - buf) - 1;
        endbuf = wcschr(endbuf + 1, '\n');
    }

    bool useConsoleOrFile = true;
    if (!Output::s_capture)
    {
        if (Output::s_useDebuggerWindow)
        {
            OutputDebugStringW(buf);
            useConsoleOrFile = false;
        }
#ifdef ENABLE_TRACE
        if (Output::s_inMemoryLogger)
        {
            s_inMemoryLogger->Write(buf);
            useConsoleOrFile = false;
        }
#endif
    }

    if (useConsoleOrFile)
    {
        if (s_file == nullptr || Output::s_capture)
        {
#ifdef _WIN32
            bool addToBuffer = true;
            if (Output::bufferFreeSize < size + 1)
            {
                if (Output::bufferAllocSize > MAX_OUTPUT_BUFFER_SIZE && !Output::s_capture)
                {
                    Output::Flush();
                    if (Output::bufferFreeSize < size + 1)
                    {
                        DirectPrint(buf);
                        addToBuffer = false;
                    }
                }
                else
                {
                    size_t oldBufferSize = bufferAllocSize - bufferFreeSize;
                    size_t newBufferAllocSize = (bufferAllocSize + size + 1) * 4 / 3;
                    char16 * newBuffer = (char16 *)realloc(buffer, (newBufferAllocSize * sizeof(char16)));
                    if (newBuffer == nullptr)
                    {
                        // See if I can just flush it and print directly
                        Output::Flush();

                        // Reset the buffer
                        free(Output::buffer);
                        Output::buffer = nullptr;
                        Output::bufferAllocSize = 0;
                        Output::bufferFreeSize = 0;

                        // Print it directly
                        DirectPrint(buf);
                        addToBuffer = false;
                    }
                    else
                    {
                        bufferAllocSize = newBufferAllocSize;
                        buffer = newBuffer;
                        bufferFreeSize = bufferAllocSize - oldBufferSize;
                    }
                }
            }
            if (addToBuffer)
            {
                Assert(Output::bufferFreeSize >= size + 1);
                memcpy_s(Output::buffer + Output::bufferAllocSize - Output::bufferFreeSize, Output::bufferFreeSize * sizeof(char16),
                    buf, size * sizeof(char16));
                bufferFreeSize -= size;
                Output::buffer[Output::bufferAllocSize - Output::bufferFreeSize] = _u('\0');  // null terminate explicitly
            }
#else
            DirectPrint(buf);
#endif
        }
        else
        {
            fwprintf_s(Output::s_file, _u("%s"), buf);
        }

        if(s_outputFile != nullptr && !Output::s_capture)
        {
            fwprintf_s(s_outputFile, _u("%s"), buf);
        }
    }

    Output::Flush();

    return size;
}